

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-arithm.cpp
# Opt level: O3

void test_arithm<double>(uint length,double value1,double value2,bool allowTrash)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  undefined8 *puVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  shared_ptr<double> pv1;
  shared_ptr<double> pv2;
  shared_ptr<double> presult;
  
  uVar4 = (ulong)length;
  uVar3 = 0xffffffffffffffff;
  if (-1 < (int)length) {
    uVar3 = uVar4 * 8;
  }
  presult.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)value2;
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new__(uVar3);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<double*,void(*)(double*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pv1,p_Var1,nosimd::common::free<double>)
  ;
  pv1.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new__(uVar3);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<double*,void(*)(double*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pv2,
             pv1.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             nosimd::common::free<double>);
  uVar3 = 0xffffffffffffffff;
  if (-1 < (int)(length + 1)) {
    uVar3 = (ulong)(length + 1) * 8;
  }
  pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new__(uVar3);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<double*,void(*)(double*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&presult,
             pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             nosimd::common::free<double>);
  (&(pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
    _vptr__Sp_counted_base)[uVar4] = (_func_int **)0x405fc00000000000;
  if (0 < (int)length) {
    uVar3 = 0;
    do {
      (&p_Var1->_vptr__Sp_counted_base)[uVar3] = (_func_int **)value1;
      uVar3 = uVar3 + 1;
    } while (uVar4 != uVar3);
    uVar3 = 0;
    do {
      (&(pv1.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _vptr__Sp_counted_base)[uVar3] =
           (_func_int **)
           presult.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      uVar3 = uVar3 + 1;
    } while (uVar4 != uVar3);
  }
  if (length != 0) {
    uVar3 = 0;
    do {
      dVar6 = (double)(&p_Var1->_vptr__Sp_counted_base)[uVar3] - value1;
      uVar5 = -(ulong)(dVar6 < 0.0);
      if ((2.220446049250313e-16 <=
           (double)(~uVar5 & (ulong)dVar6 |
                   (ulong)(value1 - (double)(&p_Var1->_vptr__Sp_counted_base)[uVar3]) & uVar5)) ||
         (dVar6 = (double)(&(pv1.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                            _M_pi)->_vptr__Sp_counted_base)[uVar3] -
                  (double)presult.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                          ._M_pi, uVar5 = -(ulong)(dVar6 < 0.0),
         2.220446049250313e-16 <=
         (double)(~uVar5 & (ulong)dVar6 |
                 (ulong)((double)presult.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi -
                        (double)(&(pv1.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount._M_pi)->_vptr__Sp_counted_base)[uVar3]) & uVar5))) {
        puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar2 = "void test_arithm(unsigned int, T, T, bool) [T = double]";
        *(undefined4 *)(puVar2 + 1) = 0x1a;
        *(uint *)((long)puVar2 + 0xc) = length;
        __cxa_throw(puVar2,&Exception::typeinfo,0);
      }
      uVar3 = uVar3 + 1;
    } while (uVar4 != uVar3);
  }
  if (p_Var1 == pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi) {
    if (0 < (int)length) {
      uVar3 = 0;
      do {
        (&(pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _vptr__Sp_counted_base)[uVar3] =
             (_func_int **)
             ((double)(&(pv1.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                        _M_pi)->_vptr__Sp_counted_base)[uVar3] +
             (double)(&(pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                       )->_vptr__Sp_counted_base)[uVar3]);
        uVar3 = uVar3 + 1;
      } while (uVar4 != uVar3);
    }
  }
  else if (pv1.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi ==
           pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi) {
    if (0 < (int)length) {
      uVar3 = 0;
      do {
        (&(pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _vptr__Sp_counted_base)[uVar3] =
             (_func_int **)
             ((double)(&p_Var1->_vptr__Sp_counted_base)[uVar3] +
             (double)(&(pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                       )->_vptr__Sp_counted_base)[uVar3]);
        uVar3 = uVar3 + 1;
      } while (uVar4 != uVar3);
    }
  }
  else if (0 < (int)length) {
    uVar3 = 0;
    do {
      (&(pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _vptr__Sp_counted_base)[uVar3] =
           (_func_int **)
           ((double)(&p_Var1->_vptr__Sp_counted_base)[uVar3] +
           (double)(&(pv1.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                     ->_vptr__Sp_counted_base)[uVar3]);
      uVar3 = uVar3 + 1;
    } while (uVar4 != uVar3);
  }
  dVar6 = value1 + (double)presult.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi;
  if (length != 0) {
    uVar3 = 0;
    do {
      dVar7 = (double)(&(pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                        _M_pi)->_vptr__Sp_counted_base)[uVar3] - dVar6;
      uVar5 = -(ulong)(dVar7 < 0.0);
      if (2.220446049250313e-16 <=
          (double)(~uVar5 & (ulong)dVar7 |
                  (ulong)(dVar6 - (double)(&(pv2.
                                             super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>.
                                             _M_refcount._M_pi)->_vptr__Sp_counted_base)[uVar3]) &
                  uVar5)) {
        puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar2 = "void test_arithm(unsigned int, T, T, bool) [T = double]";
        *(undefined4 *)(puVar2 + 1) = 0x22;
        *(uint *)((long)puVar2 + 0xc) = length;
        __cxa_throw(puVar2,&Exception::typeinfo,0);
      }
      uVar3 = uVar3 + 1;
    } while (uVar4 != uVar3);
  }
  if (p_Var1 == pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi) {
    if (0 < (int)length) {
      uVar3 = 0;
      do {
        (&(pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _vptr__Sp_counted_base)[uVar3] =
             (_func_int **)
             ((double)(&(pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                        _M_pi)->_vptr__Sp_counted_base)[uVar3] -
             (double)(&(pv1.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                       )->_vptr__Sp_counted_base)[uVar3]);
        uVar3 = uVar3 + 1;
      } while (uVar4 != uVar3);
    }
  }
  else if (0 < (int)length) {
    uVar3 = 0;
    do {
      (&(pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _vptr__Sp_counted_base)[uVar3] =
           (_func_int **)
           ((double)(&p_Var1->_vptr__Sp_counted_base)[uVar3] -
           (double)(&(pv1.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                     ->_vptr__Sp_counted_base)[uVar3]);
      uVar3 = uVar3 + 1;
    } while (uVar4 != uVar3);
  }
  dVar7 = value1 - (double)presult.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi;
  if (length != 0) {
    uVar3 = 0;
    do {
      dVar8 = (double)(&(pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                        _M_pi)->_vptr__Sp_counted_base)[uVar3] - dVar7;
      uVar5 = -(ulong)(dVar8 < 0.0);
      if (2.220446049250313e-16 <=
          (double)(~uVar5 & (ulong)dVar8 |
                  (ulong)(dVar7 - (double)(&(pv2.
                                             super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>.
                                             _M_refcount._M_pi)->_vptr__Sp_counted_base)[uVar3]) &
                  uVar5)) {
        puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar2 = "void test_arithm(unsigned int, T, T, bool) [T = double]";
        *(undefined4 *)(puVar2 + 1) = 0x2a;
        *(uint *)((long)puVar2 + 0xc) = length;
        __cxa_throw(puVar2,&Exception::typeinfo,0);
      }
      uVar3 = uVar3 + 1;
    } while (uVar4 != uVar3);
  }
  if (p_Var1 == pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi) {
    if (0 < (int)length) {
      uVar3 = 0;
      do {
        (&(pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _vptr__Sp_counted_base)[uVar3] =
             (_func_int **)
             ((double)(&(pv1.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                        _M_pi)->_vptr__Sp_counted_base)[uVar3] *
             (double)(&(pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                       )->_vptr__Sp_counted_base)[uVar3]);
        uVar3 = uVar3 + 1;
      } while (uVar4 != uVar3);
    }
  }
  else if (pv1.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi ==
           pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi) {
    if (0 < (int)length) {
      uVar3 = 0;
      do {
        (&(pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _vptr__Sp_counted_base)[uVar3] =
             (_func_int **)
             ((double)(&p_Var1->_vptr__Sp_counted_base)[uVar3] *
             (double)(&(pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                       )->_vptr__Sp_counted_base)[uVar3]);
        uVar3 = uVar3 + 1;
      } while (uVar4 != uVar3);
    }
  }
  else if (0 < (int)length) {
    uVar3 = 0;
    do {
      (&(pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _vptr__Sp_counted_base)[uVar3] =
           (_func_int **)
           ((double)(&p_Var1->_vptr__Sp_counted_base)[uVar3] *
           (double)(&(pv1.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                     ->_vptr__Sp_counted_base)[uVar3]);
      uVar3 = uVar3 + 1;
    } while (uVar4 != uVar3);
  }
  dVar8 = value1 * (double)presult.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi;
  if (length != 0) {
    uVar3 = 0;
    do {
      dVar9 = (double)(&(pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                        _M_pi)->_vptr__Sp_counted_base)[uVar3] - dVar8;
      uVar5 = -(ulong)(dVar9 < 0.0);
      if (2.220446049250313e-16 <=
          (double)(~uVar5 & (ulong)dVar9 |
                  (ulong)(dVar8 - (double)(&(pv2.
                                             super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>.
                                             _M_refcount._M_pi)->_vptr__Sp_counted_base)[uVar3]) &
                  uVar5)) {
        puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar2 = "void test_arithm(unsigned int, T, T, bool) [T = double]";
        *(undefined4 *)(puVar2 + 1) = 0x32;
        *(uint *)((long)puVar2 + 0xc) = length;
        __cxa_throw(puVar2,&Exception::typeinfo,0);
      }
      uVar3 = uVar3 + 1;
    } while (uVar4 != uVar3);
  }
  if (p_Var1 == pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi) {
    if (0 < (int)length) {
      uVar3 = 0;
      do {
        (&(pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _vptr__Sp_counted_base)[uVar3] =
             (_func_int **)
             ((double)(&(pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                        _M_pi)->_vptr__Sp_counted_base)[uVar3] /
             (double)(&(pv1.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                       )->_vptr__Sp_counted_base)[uVar3]);
        uVar3 = uVar3 + 1;
      } while (uVar4 != uVar3);
    }
  }
  else if (0 < (int)length) {
    uVar3 = 0;
    do {
      (&(pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _vptr__Sp_counted_base)[uVar3] =
           (_func_int **)
           ((double)(&p_Var1->_vptr__Sp_counted_base)[uVar3] /
           (double)(&(pv1.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                     ->_vptr__Sp_counted_base)[uVar3]);
      uVar3 = uVar3 + 1;
    } while (uVar4 != uVar3);
  }
  dVar9 = value1 / (double)presult.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi;
  if (length != 0) {
    uVar3 = 0;
    do {
      dVar10 = (double)(&(pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi)->_vptr__Sp_counted_base)[uVar3] - dVar9;
      uVar5 = -(ulong)(dVar10 < 0.0);
      if (2.220446049250313e-16 <=
          (double)(~uVar5 & (ulong)dVar10 |
                  (ulong)(dVar9 - (double)(&(pv2.
                                             super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>.
                                             _M_refcount._M_pi)->_vptr__Sp_counted_base)[uVar3]) &
                  uVar5)) {
        puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar2 = "void test_arithm(unsigned int, T, T, bool) [T = double]";
        *(undefined4 *)(puVar2 + 1) = 0x3a;
        *(uint *)((long)puVar2 + 0xc) = length;
        __cxa_throw(puVar2,&Exception::typeinfo,0);
      }
      uVar3 = uVar3 + 1;
    } while (uVar4 != uVar3);
  }
  if (p_Var1 == pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi) {
    if (0 < (int)length) {
      uVar3 = 0;
      do {
        (&(pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _vptr__Sp_counted_base)[uVar3] =
             (_func_int **)
             ((double)(&(pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                        _M_pi)->_vptr__Sp_counted_base)[uVar3] +
             (double)presult.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi);
        uVar3 = uVar3 + 1;
      } while (uVar4 != uVar3);
    }
  }
  else if (0 < (int)length) {
    uVar3 = 0;
    do {
      (&(pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _vptr__Sp_counted_base)[uVar3] =
           (_func_int **)
           ((double)(&p_Var1->_vptr__Sp_counted_base)[uVar3] +
           (double)presult.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ;
      uVar3 = uVar3 + 1;
    } while (uVar4 != uVar3);
  }
  if (length != 0) {
    uVar3 = 0;
    do {
      dVar10 = (double)(&(pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi)->_vptr__Sp_counted_base)[uVar3] - dVar6;
      uVar5 = -(ulong)(dVar10 < 0.0);
      if (2.220446049250313e-16 <=
          (double)(~uVar5 & (ulong)dVar10 |
                  (ulong)(dVar6 - (double)(&(pv2.
                                             super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>.
                                             _M_refcount._M_pi)->_vptr__Sp_counted_base)[uVar3]) &
                  uVar5)) {
        puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar2 = "void test_arithm(unsigned int, T, T, bool) [T = double]";
        *(undefined4 *)(puVar2 + 1) = 0x43;
        *(uint *)((long)puVar2 + 0xc) = length;
        __cxa_throw(puVar2,&Exception::typeinfo,0);
      }
      uVar3 = uVar3 + 1;
    } while (uVar4 != uVar3);
  }
  if (p_Var1 == pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi) {
    if (0 < (int)length) {
      uVar3 = 0;
      do {
        (&(pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _vptr__Sp_counted_base)[uVar3] =
             (_func_int **)
             ((double)(&(pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                        _M_pi)->_vptr__Sp_counted_base)[uVar3] -
             (double)presult.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi);
        uVar3 = uVar3 + 1;
      } while (uVar4 != uVar3);
    }
  }
  else if (0 < (int)length) {
    uVar3 = 0;
    do {
      (&(pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _vptr__Sp_counted_base)[uVar3] =
           (_func_int **)
           ((double)(&p_Var1->_vptr__Sp_counted_base)[uVar3] -
           (double)presult.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ;
      uVar3 = uVar3 + 1;
    } while (uVar4 != uVar3);
  }
  if (length != 0) {
    uVar3 = 0;
    do {
      if (((double)(&(pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                     ->_vptr__Sp_counted_base)[uVar3] != dVar7) ||
         (NAN((double)(&(pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                        _M_pi)->_vptr__Sp_counted_base)[uVar3]) || NAN(dVar7))) {
        puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar2 = "void test_arithm(unsigned int, T, T, bool) [T = double]";
        *(undefined4 *)(puVar2 + 1) = 0x4b;
        *(uint *)((long)puVar2 + 0xc) = length;
        __cxa_throw(puVar2,&Exception::typeinfo,0);
      }
      uVar3 = uVar3 + 1;
    } while (uVar4 != uVar3);
    if (0 < (int)length) {
      uVar3 = 0;
      do {
        (&(pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _vptr__Sp_counted_base)[uVar3] =
             (_func_int **)
             ((double)presult.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                      _M_pi - (double)(&p_Var1->_vptr__Sp_counted_base)[uVar3]);
        uVar3 = uVar3 + 1;
      } while (uVar4 != uVar3);
    }
    if (length != 0) {
      uVar3 = 0;
      do {
        dVar6 = (double)(&(pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                          _M_pi)->_vptr__Sp_counted_base)[uVar3] -
                ((double)presult.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi - value1);
        uVar5 = -(ulong)(dVar6 < 0.0);
        if (2.220446049250313e-16 <=
            (double)(~uVar5 & (ulong)dVar6 |
                    (ulong)(((double)presult.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_refcount._M_pi - value1) -
                           (double)(&(pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_refcount._M_pi)->_vptr__Sp_counted_base)[uVar3]) & uVar5))
        {
          puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
          *puVar2 = "void test_arithm(unsigned int, T, T, bool) [T = double]";
          *(undefined4 *)(puVar2 + 1) = 0x53;
          *(uint *)((long)puVar2 + 0xc) = length;
          __cxa_throw(puVar2,&Exception::typeinfo,0);
        }
        uVar3 = uVar3 + 1;
      } while (uVar4 != uVar3);
    }
  }
  if (p_Var1 == pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi) {
    if (0 < (int)length) {
      uVar3 = 0;
      do {
        (&(pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _vptr__Sp_counted_base)[uVar3] =
             (_func_int **)
             ((double)(&(pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                        _M_pi)->_vptr__Sp_counted_base)[uVar3] *
             (double)presult.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi);
        uVar3 = uVar3 + 1;
      } while (uVar4 != uVar3);
    }
  }
  else if (0 < (int)length) {
    uVar3 = 0;
    do {
      (&(pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _vptr__Sp_counted_base)[uVar3] =
           (_func_int **)
           ((double)(&p_Var1->_vptr__Sp_counted_base)[uVar3] *
           (double)presult.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ;
      uVar3 = uVar3 + 1;
    } while (uVar4 != uVar3);
  }
  if (length != 0) {
    uVar3 = 0;
    do {
      if (((double)(&(pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                     ->_vptr__Sp_counted_base)[uVar3] != dVar8) ||
         (NAN((double)(&(pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                        _M_pi)->_vptr__Sp_counted_base)[uVar3]) || NAN(dVar8))) {
        puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar2 = "void test_arithm(unsigned int, T, T, bool) [T = double]";
        *(undefined4 *)(puVar2 + 1) = 0x5b;
        *(uint *)((long)puVar2 + 0xc) = length;
        __cxa_throw(puVar2,&Exception::typeinfo,0);
      }
      uVar3 = uVar3 + 1;
    } while (uVar4 != uVar3);
  }
  if (p_Var1 == pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi) {
    if (0 < (int)length) {
      uVar3 = 0;
      do {
        (&(pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _vptr__Sp_counted_base)[uVar3] =
             (_func_int **)
             ((double)(&(pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                        _M_pi)->_vptr__Sp_counted_base)[uVar3] /
             (double)presult.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi);
        uVar3 = uVar3 + 1;
      } while (uVar4 != uVar3);
    }
  }
  else if (0 < (int)length) {
    uVar3 = 0;
    do {
      (&(pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _vptr__Sp_counted_base)[uVar3] =
           (_func_int **)
           ((double)(&p_Var1->_vptr__Sp_counted_base)[uVar3] /
           (double)presult.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ;
      uVar3 = uVar3 + 1;
    } while (uVar4 != uVar3);
  }
  if (length != 0) {
    uVar3 = 0;
    do {
      dVar6 = (double)(&(pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                        _M_pi)->_vptr__Sp_counted_base)[uVar3] - dVar9;
      uVar5 = -(ulong)(dVar6 < 0.0);
      if (2.220446049250313e-16 <=
          (double)(~uVar5 & (ulong)dVar6 |
                  (ulong)(dVar9 - (double)(&(pv2.
                                             super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>.
                                             _M_refcount._M_pi)->_vptr__Sp_counted_base)[uVar3]) &
                  uVar5)) {
        puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar2 = "void test_arithm(unsigned int, T, T, bool) [T = double]";
        *(undefined4 *)(puVar2 + 1) = 99;
        *(uint *)((long)puVar2 + 0xc) = length;
        __cxa_throw(puVar2,&Exception::typeinfo,0);
      }
      uVar3 = uVar3 + 1;
    } while (uVar4 != uVar3);
    if (0 < (int)length) {
      uVar3 = 0;
      do {
        (&(pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _vptr__Sp_counted_base)[uVar3] =
             (_func_int **)
             ((double)presult.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                      _M_pi / (double)(&p_Var1->_vptr__Sp_counted_base)[uVar3]);
        uVar3 = uVar3 + 1;
      } while (uVar4 != uVar3);
    }
    if (length != 0) {
      uVar3 = 0;
      do {
        dVar6 = (double)(&(pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                          _M_pi)->_vptr__Sp_counted_base)[uVar3] -
                (double)presult.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                        _M_pi / value1;
        uVar5 = -(ulong)(dVar6 < 0.0);
        if (2.220446049250313e-16 <=
            (double)(~uVar5 & (ulong)dVar6 |
                    (ulong)((double)presult.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount._M_pi / value1 -
                           (double)(&(pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_refcount._M_pi)->_vptr__Sp_counted_base)[uVar3]) & uVar5))
        {
          puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
          *puVar2 = "void test_arithm(unsigned int, T, T, bool) [T = double]";
          *(undefined4 *)(puVar2 + 1) = 0x6b;
          *(uint *)((long)puVar2 + 0xc) = length;
          __cxa_throw(puVar2,&Exception::typeinfo,0);
        }
        uVar3 = uVar3 + 1;
      } while (uVar4 != uVar3);
    }
  }
  if ((!allowTrash) &&
     (((double)(&(pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                 _vptr__Sp_counted_base)[uVar4] != 127.0 ||
      (NAN((double)(&(pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                     ->_vptr__Sp_counted_base)[uVar4]))))) {
    puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
    *puVar2 = "void test_arithm(unsigned int, T, T, bool) [T = double]";
    *(undefined4 *)(puVar2 + 1) = 0x70;
    *(uint *)((long)puVar2 + 0xc) = length;
    __cxa_throw(puVar2,&Exception::typeinfo,0);
  }
  if (presult.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0)
  {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               presult.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  if (pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  if (pv1.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               pv1.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return;
}

Assistant:

void test_arithm(unsigned length, T value1, T value2, bool allowTrash = false)
{
    auto pv1 = std::shared_ptr<T>(simd::malloc<T>(length), simd::free<T>);
    auto pv2 = std::shared_ptr<T>(simd::malloc<T>(length), simd::free<T>);
    auto presult = std::shared_ptr<T>(simd::malloc<T>(length+1), simd::free<T>);
    T * v1 = pv1.get();
    T * v2 = pv2.get();
    T * result = presult.get();
    result[length] = 0x7f;

    simd::set(value1, v1, length);
    simd::set(value2, v2, length);

    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(v1[i], value1) || ! equal(v2[i], value2))
            FAIL();
    }

    T r = value1 + value2;
    arithm::add(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 - value2;
    arithm::sub(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 * value2;
    arithm::mul(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 / value2;
    arithm::div(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

#ifndef TEST_FIXED
    r = value1 + value2;
    simd::addC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 - value2;
    simd::subC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (result[i] != r)
            FAIL();
    }

    r = value2 - value1;
    simd::subCRev(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 * value2;
    simd::mulC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (result[i] != r)
            FAIL();
    }

    r = value1 / value2;
    simd::divC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value2 / value1;
    simd::divCRev(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }
#endif // TEST_FIXED

    if (!allowTrash && result[length] != 0x7f)
        FAIL();
}